

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

int check_msa_access(DisasContext_conflict6 *ctx)

{
  uint uVar1;
  int excp;
  int extraout_EAX;
  int extraout_EAX_00;
  
  uVar1 = ctx->hflags;
  if ((uVar1 & 0x60) == 0x20) {
    generate_exception_end(ctx,0x14);
    return extraout_EAX;
  }
  if ((uVar1 >> 0x18 & 1) != 0) {
    return uVar1;
  }
  excp = 0x22;
  if ((ctx->insn_flags & 0x20000000000) == 0) {
    excp = 0x14;
  }
  generate_exception_end(ctx,excp);
  return extraout_EAX_00;
}

Assistant:

static inline int check_msa_access(DisasContext *ctx)
{
    if (unlikely((ctx->hflags & MIPS_HFLAG_FPU) &&
                 !(ctx->hflags & MIPS_HFLAG_F64))) {
        generate_exception_end(ctx, EXCP_RI);
        return 0;
    }

    if (unlikely(!(ctx->hflags & MIPS_HFLAG_MSA))) {
        if (ctx->insn_flags & ASE_MSA) {
            generate_exception_end(ctx, EXCP_MSADIS);
            return 0;
        } else {
            generate_exception_end(ctx, EXCP_RI);
            return 0;
        }
    }
    return 1;
}